

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O3

void __thiscall cmCTestMultiProcessHandler::PrintTestList(cmCTestMultiProcessHandler *this)

{
  uint uVar1;
  cmCTestTestHandler *pcVar2;
  _Base_ptr p_Var3;
  cmCTestTestProperties *pcVar4;
  cmCTest *pcVar5;
  char *__s;
  char cVar6;
  _Rb_tree_node_base *p_Var7;
  ostream *poVar8;
  size_t sVar9;
  long lVar10;
  undefined8 in_RDX;
  pointer pbVar11;
  _Rb_tree_color _Var12;
  undefined1 auVar13 [16];
  string current_dir;
  ostringstream cmCTestLog_msg_5;
  ostringstream indexStr;
  cmCTestRunTest testRun;
  undefined1 auStack_588 [8];
  long *local_580;
  long local_578;
  long local_570 [2];
  _Rb_tree_header *local_560;
  _Rb_tree_node_base *local_558;
  string local_550;
  long *local_530 [2];
  long local_520 [12];
  ios_base local_4c0 [264];
  long *local_3b8 [2];
  long local_3a8 [12];
  ios_base local_348 [264];
  undefined1 local_240 [408];
  int local_a8;
  
  pcVar2 = this->TestHandler;
  _Var12 = _S_red;
  p_Var7 = (this->Tests).
           super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)p_Var7 !=
         &(this->Tests).
          super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
          ._M_t._M_impl.super__Rb_tree_header) {
    if ((int)_Var12 < (int)p_Var7[1]._M_color) {
      _Var12 = p_Var7[1]._M_color;
    }
    auVar13 = std::_Rb_tree_increment(p_Var7);
    in_RDX = auVar13._8_8_;
    p_Var7 = auVar13._0_8_;
  }
  pcVar2->MaxIndex = _Var12;
  p_Var3 = (this->Properties).
           super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  auVar13._8_8_ = in_RDX;
  auVar13._0_8_ = p_Var3;
  local_560 = &(this->Properties).
               super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
               ._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != local_560) {
    do {
      local_558 = auVar13._0_8_;
      pcVar4 = (cmCTestTestProperties *)local_558[1]._M_parent;
      cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
                (&local_550,(SystemTools *)0x1,auVar13[8]);
      cmsys::SystemTools::ChangeDirectory(&pcVar4->Directory);
      cmCTestRunTest::cmCTestRunTest((cmCTestRunTest *)local_240,this->TestHandler);
      local_a8 = pcVar4->Index;
      local_240._0_8_ = pcVar4;
      cmCTestRunTest::ComputeArguments((cmCTestRunTest *)local_240);
      if ((pcVar4->Labels).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pcVar4->Labels).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b8,"Labels:",7);
        pcVar5 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar5,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x317,(char *)local_530[0],this->Quiet);
        if (local_530[0] != local_520) {
          operator_delete(local_530[0],local_520[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b8);
        std::ios_base::~ios_base(local_348);
        pbVar11 = (pcVar4->Labels).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (pbVar11 !=
            (pcVar4->Labels).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          do {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b8," ",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_3b8,(pbVar11->_M_dataplus)._M_p,pbVar11->_M_string_length);
            pcVar5 = this->CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar5,4,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                         ,0x31d,(char *)local_530[0],this->Quiet);
            if (local_530[0] != local_520) {
              operator_delete(local_530[0],local_520[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b8);
            std::ios_base::~ios_base(local_348);
            pbVar11 = pbVar11 + 1;
          } while (pbVar11 !=
                   (pcVar4->Labels).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
          if (pbVar11 !=
              (pcVar4->Labels).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b8);
            cVar6 = (char)(ostringstream *)local_3b8;
            std::ios::widen((char)local_3b8[0][-3] + cVar6);
            std::ostream::put(cVar6);
            std::ostream::flush();
            pcVar5 = this->CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar5,4,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                         ,0x322,(char *)local_530[0],this->Quiet);
            if (local_530[0] != local_520) {
              operator_delete(local_530[0],local_520[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b8);
            std::ios_base::~ios_base(local_348);
          }
        }
      }
      if (this->TestHandler->MemCheck == true) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3b8,"  Memory Check",0xe);
        pcVar5 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar5,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x328,(char *)local_530[0],this->Quiet);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b8,"  Test",6);
        pcVar5 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar5,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x32c,(char *)local_530[0],this->Quiet);
      }
      if (local_530[0] != local_520) {
        operator_delete(local_530[0],local_520[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b8);
      std::ios_base::~ios_base(local_348);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b8," #",2);
      poVar8 = (ostream *)std::ostream::operator<<((ostringstream *)local_3b8,pcVar4->Index);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,":",1);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_530);
      uVar1 = this->TestHandler->MaxIndex;
      lVar10 = 5 - (ulong)(uVar1 < 10);
      if (99 < uVar1) {
        lVar10 = 6;
      }
      *(long *)((long)local_520 + local_530[0][-3]) = lVar10;
      std::__cxx11::stringbuf::str();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_530,(char *)local_580,local_578);
      if (local_580 != local_570) {
        operator_delete(local_580,local_570[0] + 1);
      }
      pcVar5 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar5,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x332,(char *)local_580,this->Quiet);
      if (local_580 != local_570) {
        operator_delete(local_580,local_570[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_530);
      std::ios_base::~ios_base(local_4c0);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_530);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_530," ",1);
      pcVar5 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar5,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x333,(char *)local_580,this->Quiet);
      if (local_580 != local_570) {
        operator_delete(local_580,local_570[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_530);
      std::ios_base::~ios_base(local_4c0);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_530);
      __s = (pcVar4->Name)._M_dataplus._M_p;
      if (__s == (char *)0x0) {
        std::ios::clear((int)auStack_588 + (int)local_530[0][-3] + 0x58);
      }
      else {
        sVar9 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_530,__s,sVar9);
      }
      cVar6 = (char)(ostringstream *)local_530;
      std::ios::widen((char)local_530[0][-3] + cVar6);
      std::ostream::put(cVar6);
      std::ostream::flush();
      pcVar5 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar5,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x335,(char *)local_580,this->Quiet);
      if (local_580 != local_570) {
        operator_delete(local_580,local_570[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_530);
      std::ios_base::~ios_base(local_4c0);
      cmsys::SystemTools::ChangeDirectory(&local_550);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b8);
      std::ios_base::~ios_base(local_348);
      cmCTestRunTest::~cmCTestRunTest((cmCTestRunTest *)local_240);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_550._M_dataplus._M_p != &local_550.field_2) {
        operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
      }
      auVar13 = std::_Rb_tree_increment(local_558);
    } while ((_Rb_tree_header *)auVar13._0_8_ != local_560);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
  std::ios::widen((char)(ostringstream *)local_240 +
                  (char)(((cmCTestTestProperties *)(local_240._0_8_ + -0x1a0))->LockedResources).
                        _M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  std::ostream::put((char)local_240);
  poVar8 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Total Tests: ",0xd);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  pcVar5 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar5,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
               ,0x33b,(char *)local_3b8[0],this->Quiet);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_240);
  std::ios_base::~ios_base((ios_base *)(local_240 + 0x70));
  return;
}

Assistant:

void cmCTestMultiProcessHandler::PrintTestList()
{
  this->TestHandler->SetMaxIndex(this->FindMaxIndex());
  int count = 0;

  for (PropertiesMap::iterator it = this->Properties.begin();
       it != this->Properties.end(); ++it)
    {
    count++;
    cmCTestTestHandler::cmCTestTestProperties& p = *it->second;

    //push working dir
    std::string current_dir = cmSystemTools::GetCurrentWorkingDirectory();
    cmSystemTools::ChangeDirectory(p.Directory);

    cmCTestRunTest testRun(this->TestHandler);
    testRun.SetIndex(p.Index);
    testRun.SetTestProperties(&p);
    testRun.ComputeArguments(); //logs the command in verbose mode

    if(!p.Labels.empty()) //print the labels
      {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, "Labels:",
        this->Quiet);
      }
    for(std::vector<std::string>::iterator label = p.Labels.begin();
        label != p.Labels.end(); ++label)
      {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, " " << *label,
        this->Quiet);
      }
    if(!p.Labels.empty()) //print the labels
      {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, std::endl,
        this->Quiet);
      }

    if (this->TestHandler->MemCheck)
      {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "  Memory Check",
        this->Quiet);
      }
     else
      {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "  Test", this->Quiet);
      }
    std::ostringstream indexStr;
    indexStr << " #" << p.Index << ":";
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
      std::setw(3 + getNumWidth(this->TestHandler->GetMaxIndex()))
      << indexStr.str(), this->Quiet);
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, " ", this->Quiet);
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
      p.Name.c_str() << std::endl, this->Quiet);
    //pop working dir
    cmSystemTools::ChangeDirectory(current_dir);
    }

  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, std::endl << "Total Tests: "
    << this->Total << std::endl, this->Quiet);
}